

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

t_template * template_new(t_symbol *templatesym,int argc,t_atom *argv)

{
  char cVar1;
  int iVar2;
  word wVar3;
  t_atom *ptVar4;
  _template *x;
  t_dataslot *ptVar5;
  t_symbol *ptVar6;
  long lVar7;
  t_symbol *ptVar8;
  uint uVar9;
  int local_44;
  
  x = (_template *)pd_new(template_class);
  x->t_n = 0;
  ptVar5 = (t_dataslot *)getbytes(0);
  x->t_vec = ptVar5;
  x->t_next = pd_maininstance.pd_templatelist;
  pd_maininstance.pd_templatelist = x;
  do {
    uVar9 = 1;
    if (argc < 1) {
      cVar1 = *templatesym->s_name;
      x->t_sym = templatesym;
      if (cVar1 != '\0') {
        pd_bind((t_pd *)x,templatesym);
      }
      return x;
    }
    if (((argc == 1) || (uVar9 = argc, argv->a_type != A_SYMBOL)) || (argv[1].a_type != A_SYMBOL))
    goto LAB_00152447;
    ptVar8 = (argv->a_w).w_symbol;
    wVar3 = argv[1].a_w;
    if (ptVar8 == &s_float) {
      local_44 = 0;
LAB_00152401:
      ptVar8 = &s_;
LAB_00152408:
      iVar2 = x->t_n;
      lVar7 = (long)iVar2;
      ptVar5 = (t_dataslot *)resizebytes(x->t_vec,lVar7 * 0x18,lVar7 * 0x18 + 0x18);
      x->t_vec = ptVar5;
      x->t_n = iVar2 + 1;
      ptVar5[lVar7].ds_type = local_44;
      ptVar5[lVar7].ds_name = (t_symbol *)wVar3;
      ptVar5[lVar7].ds_arraytemplate = ptVar8;
      uVar9 = argc;
    }
    else {
      if (ptVar8 == &s_symbol) {
        local_44 = 1;
        goto LAB_00152401;
      }
      ptVar6 = gensym("text");
      if ((ptVar8 == &s_list) || (ptVar8 == ptVar6)) {
        local_44 = 2;
        goto LAB_00152401;
      }
      ptVar6 = gensym("array");
      if (ptVar8 == ptVar6) {
        if (((uint)argc < 3) || (argv[2].a_type != A_SYMBOL)) {
          pd_error(x,"array lacks element template or name");
          goto LAB_00152447;
        }
        ptVar4 = argv + 2;
        argv = argv + 1;
        ptVar8 = canvas_makebindsym((ptVar4->a_w).w_symbol);
        argc = argc - 1;
        local_44 = 3;
        goto LAB_00152408;
      }
      pd_error(x,"%s: no such type",ptVar8->s_name);
    }
LAB_00152447:
    argc = uVar9 - 2;
    argv = argv + 2;
  } while( true );
}

Assistant:

t_template *template_new(t_symbol *templatesym, int argc, t_atom *argv)
{
    t_template *x = (t_template *)pd_new(template_class);
    x->t_n = 0;
    x->t_vec = (t_dataslot *)t_getbytes(0);
    x->t_next = 0;
    template_addtolist(x);
    while (argc > 0)
    {
        int newtype, oldn, newn;
        t_symbol *newname, *newarraytemplate = &s_, *newtypesym;
        if (argc < 2 || argv[0].a_type != A_SYMBOL ||
            argv[1].a_type != A_SYMBOL)
                goto bad;
        newtypesym = argv[0].a_w.w_symbol;
        newname = argv[1].a_w.w_symbol;
        if (newtypesym == &s_float)
            newtype = DT_FLOAT;
        else if (newtypesym == &s_symbol)
            newtype = DT_SYMBOL;
                /* "list" is old name.. accepted here but never saved as such */
        else if (newtypesym == gensym("text") || newtypesym == &s_list)
            newtype = DT_TEXT;
        else if (newtypesym == gensym("array"))
        {
            if (argc < 3 || argv[2].a_type != A_SYMBOL)
            {
                pd_error(x, "array lacks element template or name");
                goto bad;
            }
            newarraytemplate = canvas_makebindsym(argv[2].a_w.w_symbol);
            newtype = DT_ARRAY;
            argc--;
            argv++;
        }
        else
        {
            pd_error(x, "%s: no such type", newtypesym->s_name);
            goto bad;
        }
        newn = (oldn = x->t_n) + 1;
        x->t_vec = (t_dataslot *)t_resizebytes(x->t_vec,
            oldn * sizeof(*x->t_vec), newn * sizeof(*x->t_vec));
        x->t_n = newn;
        x->t_vec[oldn].ds_type = newtype;
        x->t_vec[oldn].ds_name = newname;
        x->t_vec[oldn].ds_arraytemplate = newarraytemplate;
    bad:
        argc -= 2; argv += 2;
    }
    if (*templatesym->s_name)
    {
        x->t_sym = templatesym;
        pd_bind(&x->t_pdobj, x->t_sym);
    }
    else x->t_sym = templatesym;
    return (x);
}